

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O0

double __thiscall
imrt::Plan::incremental_eval(Plan *this,Station *station,int i,int j,double intensity)

{
  int iVar1;
  pair<int,_int> this_00;
  Plan *this_01;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff_00;
  double dVar2;
  pair<int,_double> pVar3;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  key_type *in_stack_ffffffffffffffa8;
  
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x173e62);
  this_00 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff68,(int *)0x173e8a);
  this_01 = (Plan *)std::
                    map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                    ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                  *)this_00,in_stack_ffffffffffffffa8);
  pVar3 = std::make_pair<int&,double&>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  diff_00 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar3.second;
  iVar1 = pVar3.first;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_01,
             (value_type *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
  dVar2 = incremental_eval(this_01,(Station *)CONCAT44(iVar1,in_stack_ffffffffffffff78),diff_00);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x173f19);
  return dVar2;
}

Assistant:

double incremental_eval (Station& station, int i, int j, double intensity){
		list< pair< int, double > > diff;
		diff.push_back(make_pair(station.pos2beam[make_pair(i,j)],intensity));
		return incremental_eval (station, diff);
	}